

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O0

MppDevBatTask * batch_add(MppDevBatServ *server)

{
  MppDevBatTask *batch_00;
  MppDevBatTask *batch;
  MppDevBatServ *server_local;
  
  batch_00 = (MppDevBatTask *)mpp_mem_pool_get_f("batch_add",server->batch_pool);
  if ((batch_00 == (MppDevBatTask *)0x0) &&
     (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"batch","batch_add",
                 0xb7), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if (batch_00 != (MppDevBatTask *)0x0) {
    (batch_00->link_server).next = &batch_00->link_server;
    (batch_00->link_server).prev = &batch_00->link_server;
    (batch_00->link_tasks).next = &batch_00->link_tasks;
    (batch_00->link_tasks).prev = &batch_00->link_tasks;
    batch_00->send_reqs = (MppReqV1 *)(batch_00 + 1);
    batch_00->wait_reqs = batch_00->send_reqs + (server->max_task_in_batch << 4);
    batch_00->bat_cmd = (MppDevBatCmd *)(batch_00->wait_reqs + (server->max_task_in_batch << 1));
    batch_reset(batch_00);
    list_add_tail(&batch_00->link_server,&server->list_batch_free);
    server->batch_free = server->batch_free + 1;
    if ((mpp_server_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_server","batch add free count %d:%d\n",(char *)0x0,
                 (ulong)(uint)server->batch_run,(ulong)(uint)server->batch_free);
    }
  }
  return batch_00;
}

Assistant:

MppDevBatTask *batch_add(MppDevBatServ *server)
{
    MppDevBatTask *batch = (MppDevBatTask *)mpp_mem_pool_get(server->batch_pool);

    mpp_assert(batch);
    if (NULL == batch)
        return batch;

    INIT_LIST_HEAD(&batch->link_server);
    INIT_LIST_HEAD(&batch->link_tasks);

    batch->send_reqs = (MppReqV1 *)(batch + 1);
    batch->wait_reqs = batch->send_reqs +
                       (server->max_task_in_batch * MAX_REQ_SEND_CNT);
    batch->bat_cmd = (MppDevBatCmd *)(batch->wait_reqs +
                                      (server->max_task_in_batch * MAX_REQ_WAIT_CNT));

    batch_reset(batch);
    list_add_tail(&batch->link_server, &server->list_batch_free);
    server->batch_free++;

    mpp_serv_dbg_flow("batch add free count %d:%d\n", server->batch_run, server->batch_free);
    return batch;
}